

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

void __thiscall DPlayerMenu::UpdateColorsets(DPlayerMenu *this)

{
  int *piVar1;
  uint uVar2;
  PClassPlayerPawn *pPVar3;
  undefined8 *puVar4;
  Node *pNVar5;
  FListMenuItem *pFVar6;
  undefined8 *puVar7;
  Node *pNVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  FName local_34;
  
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_34);
  if (pFVar6 != (FListMenuItem *)0x0) {
    PClassPlayerPawn::EnumColorSets(this->PlayerClass->Type,&this->PlayerColorSets);
    uVar11 = 0;
    (*pFVar6->_vptr_FListMenuItem[8])(pFVar6,0,"Custom");
    if ((this->PlayerColorSets).Count != 0) {
      uVar10 = 0;
      do {
        pPVar3 = this->PlayerClass->Type;
        uVar2 = (this->PlayerColorSets).Array[uVar10];
        pNVar5 = (pPVar3->ColorSets).Nodes + ((pPVar3->ColorSets).Size - 1 & uVar2);
        do {
          pNVar8 = pNVar5;
          pNVar5 = pNVar8->Next;
        } while ((pNVar8->Pair).Key != uVar2);
        uVar10 = uVar10 + 1;
        (*pFVar6->_vptr_FListMenuItem[8])
                  (pFVar6,uVar10 & 0xffffffff,
                   FName::NameData.NameArray[(pNVar8->Pair).Value.Name.Index].Text);
        uVar11 = (ulong)(this->PlayerColorSets).Count;
      } while (uVar10 < uVar11);
    }
    puVar4 = (undefined8 *)
             ((ulong)(((&DAT_00a602d8)[(long)consoleplayer * 0xa8] - 1 & 0x219) * 0x18) +
             (&DAT_00a602c8)[(long)consoleplayer * 0x54]);
    do {
      puVar7 = puVar4;
      puVar4 = (undefined8 *)*puVar7;
    } while (*(int *)(puVar7 + 1) != 0x219);
    uVar10 = 0;
    if ((int)uVar11 != 0 && *(int *)(puVar7[2] + 0x28) != -1) {
      uVar9 = 0;
      uVar10 = 0;
      do {
        piVar1 = (this->PlayerColorSets).Array + uVar9;
        uVar9 = uVar9 + 1;
        if (*piVar1 == *(int *)(puVar7[2] + 0x28)) {
          uVar10 = uVar9 & 0xffffffff;
        }
      } while (uVar11 != uVar9);
    }
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,uVar10);
  }
  return;
}

Assistant:

void DPlayerMenu::UpdateColorsets()
{
	FListMenuItem *li = GetItem(NAME_Color);
	if (li != NULL)
	{
		int sel = 0;
		PlayerClass->Type->EnumColorSets(&PlayerColorSets);
		li->SetString(0, "Custom");
		for(unsigned i=0;i<PlayerColorSets.Size(); i++)
		{
			FPlayerColorSet *colorset = PlayerClass->Type->GetColorSet(PlayerColorSets[i]);
			li->SetString(i+1, colorset->Name);
		}
		int mycolorset = players[consoleplayer].userinfo.GetColorSet();
		if (mycolorset != -1)
		{
			for(unsigned i=0;i<PlayerColorSets.Size(); i++)
			{
				if (PlayerColorSets[i] == mycolorset)
				{
					sel = i+1;
				}
			}
		}
		li->SetValue(0, sel);
	}
}